

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O3

double __thiscall tfs::TMatrix<double>::min(TMatrix<double> *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  pdVar1 = this->m_data;
  if ((((pdVar1 == (double *)0x0) || (this->m_end <= pdVar1)) || (this->m_count == 0)) ||
     (this->m_length == 0)) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                   ,"min",0x165,"empty matrix");
    dVar3 = 0.0;
  }
  else {
    dVar2 = *pdVar1;
    while (dVar3 = dVar2, pdVar1 = pdVar1 + 1, pdVar1 < this->m_end) {
      dVar2 = *pdVar1;
      if (dVar3 <= *pdVar1) {
        dVar2 = dVar3;
      }
    }
  }
  return dVar3;
}

Assistant:

inline T min( void ) const {                // Return minimum value.
            if( isEmpty()) {
                log_error( "empty matrix" );
                return 0;
            }
            const T *      data = m_data;
            const T * const end = m_end;
            
            T result = *data++;
            while( data < end ) {
                if( *data < result ) {
                    result = *data;
                }
                data++;
            }
            return result;
        }